

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O0

void allphone_backtrace(allphone_search_t *allphs,int32 f,int32 *out_score)

{
  int iVar1;
  int32 iVar2;
  void *pvVar3;
  history_t *h_00;
  s3cipid_t *ptr;
  glist_t pgVar4;
  int local_50;
  phseg_t *s;
  history_t *h;
  int local_30;
  int32 last_frm;
  int32 frm;
  int32 best_idx;
  int32 hist_idx;
  int32 best;
  int32 *out_score_local;
  int32 f_local;
  allphone_search_t *allphs_local;
  
  allphone_clear_segments(allphs);
  frm = allphs->history->n_valid;
  do {
    frm = frm + -1;
    local_30 = f;
    if (frm < 1) goto LAB_0012a27c;
    pvVar3 = blkarray_list_get(allphs->history,frm);
  } while (f < *(int *)((long)pvVar3 + 0x10));
  local_30 = *(int *)((long)pvVar3 + 0x10);
LAB_0012a27c:
  iVar1 = local_30;
  if (-1 < frm) {
    best_idx = -0x80000000;
    last_frm = -1;
    for (; local_30 == iVar1 && 0 < frm; frm = frm + -1) {
      pvVar3 = blkarray_list_get(allphs->history,frm);
      local_30 = *(int *)((long)pvVar3 + 0x10);
      if ((best_idx < *(int *)((long)pvVar3 + 8)) && (local_30 == iVar1)) {
        best_idx = *(int32 *)((long)pvVar3 + 8);
        last_frm = frm;
      }
    }
    if (-1 < last_frm) {
      if (out_score != (int32 *)0x0) {
        *out_score = best_idx;
      }
      while (0 < last_frm) {
        h_00 = (history_t *)blkarray_list_get(allphs->history,last_frm);
        ptr = (s3cipid_t *)
              __ckd_calloc__(1,0x14,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0x336);
        *ptr = h_00->phmm->ci;
        if (h_00->hist < 1) {
          local_50 = 0;
        }
        else {
          pvVar3 = blkarray_list_get(allphs->history,h_00->hist);
          local_50 = *(int *)((long)pvVar3 + 0x10) + 1;
        }
        *(int *)(ptr + 2) = local_50;
        *(frame_idx_t *)(ptr + 4) = h_00->ef;
        iVar2 = ascore(allphs,h_00);
        *(int32 *)(ptr + 6) = iVar2;
        *(int32 *)(ptr + 8) = h_00->tscore;
        pgVar4 = glist_add_ptr(allphs->segments,ptr);
        allphs->segments = pgVar4;
        last_frm = h_00->hist;
      }
    }
  }
  return;
}

Assistant:

static void
allphone_backtrace(allphone_search_t * allphs, int32 f, int32 *out_score)
{
    int32 best, hist_idx, best_idx;
    int32 frm, last_frm;
    history_t *h;
    phseg_t *s;

    /* Clear old list */
    allphone_clear_segments(allphs);

    frm = last_frm = f;
    /* Find the first history entry for the requested frame */
    hist_idx = blkarray_list_n_valid(allphs->history) - 1;
    while (hist_idx > 0) {
        h = blkarray_list_get(allphs->history, hist_idx);
        if (h->ef <= f) {
            frm = last_frm = h->ef;
            break;
        }
        hist_idx--;
    }

    if (hist_idx < 0)
        return;

    /* Find bestscore */
    best = MAX_NEG_INT32;
    best_idx = -1;
    while (frm == last_frm && hist_idx > 0) {
        h = blkarray_list_get(allphs->history, hist_idx);
        frm = h->ef;
        if (h->score > best && frm == last_frm) {
            best = h->score;
            best_idx = hist_idx;
        }
        hist_idx--;
    }

    if (best_idx < 0)
        return;

    if (out_score)
        *out_score = best;

    /* Backtrace */
    while (best_idx > 0) {
        h = blkarray_list_get(allphs->history, best_idx);
        s = (phseg_t *) ckd_calloc(1, sizeof(phseg_t));
        s->ci = h->phmm->ci;
        s->sf =
            (h->hist >
             0) ? ((history_t *) blkarray_list_get(allphs->history,
                                                   h->hist))->ef + 1 : 0;
        s->ef = h->ef;
        s->score = ascore(allphs, h);
        s->tscore = h->tscore;
        allphs->segments = glist_add_ptr(allphs->segments, s);

        best_idx = h->hist;
    }

    return;
}